

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::quantize_convolution(NetQuantize *this)

{
  int *piVar1;
  long *plVar2;
  pointer pMVar3;
  ulong uVar4;
  value_type pLVar5;
  FILE *__stream;
  void *pvVar6;
  bool bVar7;
  size_type sVar8;
  undefined8 uVar9;
  reference ppLVar10;
  pointer ppVar11;
  pointer *ppiVar12;
  string *psVar13;
  Allocator *in_RDI;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  int maxk;
  Mat weight_data_int8_scales;
  Mat bottom_blob_int8_scales;
  Convolution *convolution;
  iterator iter;
  char key [256];
  iterator iter_data;
  int i;
  int layer_count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  uint7 in_stack_fffffffffffffa08;
  uint7 in_stack_fffffffffffffa18;
  undefined1 local_578 [4];
  int in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  int *piVar14;
  Mat *in_stack_fffffffffffffa98;
  undefined4 uVar15;
  Mat *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  Mat *in_stack_fffffffffffffab0;
  void *local_4e0;
  int *local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c8;
  long *local_4c0;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  int local_4a8;
  long local_4a0;
  void *local_498;
  int *local_490;
  undefined8 local_488;
  undefined4 local_480;
  long *local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  undefined4 local_450;
  int local_44c;
  void *local_448;
  int *local_440;
  size_t local_438;
  int local_430;
  Allocator *local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  size_t local_408;
  void *local_400;
  int *local_3f8;
  size_t local_3f0;
  int local_3e8;
  Allocator *local_3e0;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  size_t local_3c0;
  value_type local_3b8;
  _Self local_3b0 [3];
  allocator local_391;
  string local_390 [32];
  _Self local_370;
  char local_368 [256];
  _Self local_268;
  _Self local_260;
  int local_258;
  int local_254;
  int local_244;
  void **local_240;
  undefined1 *local_238;
  void **local_228;
  void **local_218;
  void **local_208;
  void **local_1f8;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  pointer *local_1d8;
  pointer *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  string *local_1b8;
  string *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  undefined8 *local_1a0;
  pointer *local_198;
  pointer *local_190;
  void **local_188;
  Mat *local_180;
  void **local_178;
  Mat *local_170;
  void **local_168;
  int local_160;
  undefined4 local_15c;
  pointer *local_158;
  int local_150;
  undefined4 local_14c;
  string *local_148;
  int local_140;
  undefined4 local_13c;
  pointer *local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  undefined1 *local_98;
  void *local_90;
  void *local_80;
  void *local_70;
  void *local_60;
  void *local_50;
  pointer local_40;
  void *local_38;
  pointer local_30;
  void **local_28;
  int local_20;
  undefined4 local_1c;
  void **local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  void *__ptr;
  
  piVar14 = (int *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90);
  sVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                     in_RDI[0xb]._vptr_Allocator);
  local_254 = (int)sVar8;
  local_258 = 0;
  do {
    if (local_254 <= local_258) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI[0xb]._vptr_Allocator,
               (long)local_258);
    bVar7 = std::operator!=(in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988);
    if (!bVar7) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                 in_RDI[0xb]._vptr_Allocator,(long)local_258);
      local_260._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::find(in_stack_fffffffffffff988,(key_type *)0x178521);
      local_268._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::end(in_stack_fffffffffffff988);
      bVar7 = std::operator==(&local_260,&local_268);
      if (!bVar7) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                   in_RDI[0xb]._vptr_Allocator,(long)local_258);
        uVar9 = std::__cxx11::string::c_str();
        sprintf(local_368,"%s_param_0",uVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,local_368,&local_391);
        local_370._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::find(in_stack_fffffffffffff988,(key_type *)0x178607);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        local_3b0[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::end(in_stack_fffffffffffff988);
        bVar7 = std::operator==(&local_370,local_3b0);
        if (bVar7) {
          fprintf(_stderr,"this layer need to be quantized, but no scale param!\n");
          return -1;
        }
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                              in_RDI[0xb]._vptr_Allocator,(long)local_258);
        local_3b8 = *ppLVar10;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                                *)0x178714);
        local_180 = &ppVar11->second;
        local_178 = &local_400;
        local_400 = local_180->data;
        local_3f8 = (ppVar11->second).refcount;
        local_3f0 = (ppVar11->second).elemsize;
        local_3e8 = (ppVar11->second).elempack;
        local_3e0 = (ppVar11->second).allocator;
        local_3d8 = (ppVar11->second).dims;
        local_3d4 = (ppVar11->second).w;
        local_3d0 = (ppVar11->second).h;
        local_3cc = (ppVar11->second).d;
        local_3c8 = (ppVar11->second).c;
        local_3c0 = (ppVar11->second).cstep;
        if (local_3f8 != (int *)0x0) {
          local_c = 1;
          LOCK();
          local_10 = *local_3f8;
          *local_3f8 = *local_3f8 + 1;
          UNLOCK();
        }
        local_8 = local_178;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                                *)0x178837);
        local_170 = &ppVar11->second;
        local_168 = &local_448;
        local_448 = local_170->data;
        local_440 = (ppVar11->second).refcount;
        local_438 = (ppVar11->second).elemsize;
        local_430 = (ppVar11->second).elempack;
        local_428 = (ppVar11->second).allocator;
        local_420 = (ppVar11->second).dims;
        local_41c = (ppVar11->second).w;
        local_418 = (ppVar11->second).h;
        local_414 = (ppVar11->second).d;
        local_410 = (ppVar11->second).c;
        local_408 = (ppVar11->second).cstep;
        if (local_440 != (int *)0x0) {
          local_1c = 1;
          LOCK();
          local_20 = *local_440;
          *local_440 = *local_440 + 1;
          UNLOCK();
        }
        __stream = _stderr;
        local_18 = local_168;
        uVar9 = std::__cxx11::string::c_str();
        fprintf(__stream,"quantize_convolution %s\n",uVar9);
        pvVar6 = __ptr;
        in_stack_fffffffffffffa8c = (int)((ulong)__ptr >> 0x20);
        local_44c = *(int *)((long)&local_3b8[1]._vptr_Layer + 4) *
                    *(int *)&local_3b8[1].one_blob_only;
        uVar4 = (long)*(int *)&local_3b8[1].type.field_0x4 / (long)*(int *)&local_3b8[1]._vptr_Layer
        ;
        local_450 = (undefined4)
                    ((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                    (long)local_44c);
        ncnn::Mat::reshape(in_stack_fffffffffffffa98,(int)((ulong)piVar14 >> 0x20),(int)piVar14,
                           in_stack_fffffffffffffa8c,in_RDI);
        __ptr = pvVar6;
        local_240 = &local_4e0;
        local_4e0 = (void *)0x0;
        local_4d8 = (int *)0x0;
        local_4d0 = 0;
        local_4c8 = 0;
        local_4c0 = (long *)0x0;
        local_4b8 = 0;
        local_4b4 = 0;
        local_4b0 = 0;
        local_4ac = 0;
        local_4a8 = 0;
        local_4a0 = 0;
        ncnn::quantize_to_int8
                  (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                   (Option *)in_stack_fffffffffffffa98);
        local_188 = &local_4e0;
        if (local_4e0 != (void *)0x0) {
          local_28 = local_188;
        }
        if (local_4e0 != (void *)0x0 && local_4a0 * local_4a8 != 0) {
          ncnn::Mat::reshape((Mat *)(ulong)in_stack_fffffffffffffa18,(int)((ulong)local_188 >> 0x20)
                             ,(Allocator *)(ulong)in_stack_fffffffffffffa08);
          pLVar5 = local_3b8;
          ppiVar12 = &local_3b8[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_1a0 = (undefined8 *)local_578;
          local_198 = ppiVar12;
          if (ppiVar12 != (pointer *)local_1a0) {
            if (piVar14 != (int *)0x0) {
              local_1a4 = 1;
              LOCK();
              local_1a8 = *piVar14;
              *piVar14 = *piVar14 + 1;
              UNLOCK();
            }
            local_158 = ppiVar12;
            if (local_3b8[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              piVar1 = local_3b8[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              local_15c = 0xffffffff;
              LOCK();
              local_160 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_160 == 1) {
                if (local_3b8[1].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  local_30 = *ppiVar12;
                  if (local_30 != (pointer)0x0) {
                    free(local_30);
                  }
                }
                else {
                  pMVar3 = local_3b8[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  (**(code **)((long)pMVar3->data + 0x18))(pMVar3,*ppiVar12);
                }
              }
            }
            *ppiVar12 = (pointer)0x0;
            pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            *(undefined4 *)
             &pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_start = 0;
            *(undefined4 *)
             ((long)&pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = 0;
            pLVar5[2]._vptr_Layer = (_func_int **)0x0;
            pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *ppiVar12 = (pointer)*local_1a0;
            pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_1a0[1];
            pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0[2];
            *(undefined4 *)
             &pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)(local_1a0 + 3);
            pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1a0[4];
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_start = *(undefined4 *)(local_1a0 + 5);
            *(undefined4 *)
             ((long)&pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) =
                 *(undefined4 *)((long)local_1a0 + 0x2c);
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = *(undefined4 *)(local_1a0 + 6);
            *(undefined4 *)
             ((long)&pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_1a0 + 0x34);
            *(undefined4 *)
             &pLVar5[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1a0 + 7);
            pLVar5[2]._vptr_Layer = (_func_int **)local_1a0[8];
          }
          local_238 = local_578;
          local_190 = ppiVar12;
          local_98 = local_238;
          if (piVar14 != (int *)0x0) {
            local_9c = 0xffffffff;
            LOCK();
            local_a0 = *piVar14;
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (local_a0 == 1) {
              if (in_stack_fffffffffffffaa8 == (Mat *)0x0) {
                local_90 = __ptr;
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)((long)in_stack_fffffffffffffaa8->data + 0x18))
                          (in_stack_fffffffffffffaa8,__ptr);
              }
            }
          }
          __ptr = (void *)0x0;
          in_stack_fffffffffffffa98 = (Mat *)0x0;
          uVar15 = 0;
          uVar15 = 0;
          piVar14 = (int *)0x0;
          bVar7 = false;
        }
        else {
          local_244 = -100;
          bVar7 = true;
        }
        local_228 = &local_4e0;
        local_b8 = local_228;
        if (local_4d8 != (int *)0x0) {
          local_bc = 0xffffffff;
          LOCK();
          local_c0 = *local_4d8;
          *local_4d8 = *local_4d8 + -1;
          UNLOCK();
          if (local_c0 == 1) {
            if (local_4c0 == (long *)0x0) {
              local_80 = local_4e0;
              if (local_4e0 != (void *)0x0) {
                free(local_4e0);
              }
            }
            else {
              (**(code **)(*local_4c0 + 0x18))(local_4c0,local_4e0);
            }
          }
        }
        local_4e0 = (void *)0x0;
        local_4d0 = 0;
        local_4c8 = 0;
        local_4b8 = 0;
        local_4b4 = 0;
        local_4b0 = 0;
        local_4ac = 0;
        local_4a8 = 0;
        local_4a0 = 0;
        local_4d8 = (int *)0x0;
        local_218 = &local_498;
        local_d8 = local_218;
        if (local_490 != (int *)0x0) {
          local_dc = 0xffffffff;
          LOCK();
          local_e0 = *local_490;
          *local_490 = *local_490 + -1;
          UNLOCK();
          if (local_e0 == 1) {
            if (local_478 == (long *)0x0) {
              local_70 = local_498;
              if (local_498 != (void *)0x0) {
                free(local_498);
              }
            }
            else {
              (**(code **)(*local_478 + 0x18))(local_478,local_498);
            }
          }
        }
        pLVar5 = local_3b8;
        local_498 = (void *)0x0;
        local_488 = 0;
        local_480 = 0;
        local_470 = 0;
        local_46c = 0;
        local_468 = 0;
        local_464 = 0;
        local_460 = 0;
        local_458 = 0;
        local_490 = (int *)0x0;
        if (!bVar7) {
          *(undefined4 *)&local_3b8[1].type._M_string_length = 2;
          psVar13 = &local_3b8[2].name;
          local_1c0 = &local_448;
          local_1b8 = psVar13;
          if (psVar13 != (string *)local_1c0) {
            if (local_440 != (int *)0x0) {
              local_1c4 = 1;
              LOCK();
              local_1c8 = *local_440;
              *local_440 = *local_440 + 1;
              UNLOCK();
            }
            local_148 = psVar13;
            if (local_3b8[2].name._M_string_length != 0) {
              piVar1 = (int *)local_3b8[2].name._M_string_length;
              local_14c = 0xffffffff;
              LOCK();
              local_150 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_150 == 1) {
                if (local_3b8[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  local_38 = *(void **)psVar13;
                  if (local_38 != (void *)0x0) {
                    free(local_38);
                  }
                }
                else {
                  plVar2 = (long *)local_3b8[2].bottoms.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                  (**(code **)(*plVar2 + 0x18))(plVar2,*(undefined8 *)psVar13);
                }
              }
            }
            *(undefined8 *)psVar13 = 0;
            pLVar5[2].name.field_2._M_allocated_capacity = 0;
            *(undefined4 *)((long)&pLVar5[2].name.field_2 + 8) = 0;
            *(undefined4 *)
             &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined4 *)
             &pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
            pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            pLVar5[2].name._M_string_length = 0;
            *(void **)psVar13 = *local_1c0;
            pLVar5[2].name._M_string_length = (size_type)local_1c0[1];
            pLVar5[2].name.field_2._M_allocated_capacity = (size_type)local_1c0[2];
            *(undefined4 *)((long)&pLVar5[2].name.field_2 + 8) = *(undefined4 *)(local_1c0 + 3);
            pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1c0[4];
            *(undefined4 *)
             &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(undefined4 *)(local_1c0 + 5);
            *(undefined4 *)
             ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_1c0 + 0x2c);
            *(undefined4 *)
             &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1c0 + 6);
            *(undefined4 *)
             ((long)&pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) =
                 *(undefined4 *)((long)local_1c0 + 0x34);
            *(undefined4 *)
             &pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(undefined4 *)(local_1c0 + 7);
            pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_1c0[8];
          }
          pLVar5 = local_3b8;
          ppiVar12 = &local_3b8[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_1e0 = &local_400;
          local_1d8 = ppiVar12;
          local_1b0 = psVar13;
          if (ppiVar12 != (pointer *)local_1e0) {
            if (local_3f8 != (int *)0x0) {
              local_1e4 = 1;
              LOCK();
              local_1e8 = *local_3f8;
              *local_3f8 = *local_3f8 + 1;
              UNLOCK();
            }
            local_138 = ppiVar12;
            if (local_3b8[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              pMVar3 = local_3b8[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_13c = 0xffffffff;
              LOCK();
              local_140 = *(int *)&pMVar3->data;
              *(int *)&pMVar3->data = *(int *)&pMVar3->data + -1;
              UNLOCK();
              if (local_140 == 1) {
                if (local_3b8[2].top_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  local_40 = *ppiVar12;
                  if (local_40 != (pointer)0x0) {
                    free(local_40);
                  }
                }
                else {
                  pMVar3 = local_3b8[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  (**(code **)((long)pMVar3->data + 0x18))(pMVar3,*ppiVar12);
                }
              }
            }
            *ppiVar12 = (pointer)0x0;
            pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined4 *)
             &pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             ((long)&pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined4 *)&pLVar5[3]._vptr_Layer = 0;
            pLVar5[3].one_blob_only = false;
            pLVar5[3].support_inplace = false;
            pLVar5[3].support_vulkan = false;
            pLVar5[3].support_packing = false;
            pLVar5[3].support_bf16_storage = false;
            pLVar5[3].support_fp16_storage = false;
            pLVar5[3].support_int8_storage = false;
            pLVar5[3].support_image_storage = false;
            pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            *ppiVar12 = (pointer)*local_1e0;
            pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_1e0[1];
            pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1e0[2];
            *(undefined4 *)
             &pLVar5[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1e0 + 3);
            pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1e0[4];
            *(undefined4 *)
             &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = *(undefined4 *)(local_1e0 + 5);
            *(undefined4 *)
             ((long)&pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_1e0 + 0x2c);
            *(undefined4 *)
             &pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1e0 + 6);
            *(undefined4 *)
             ((long)&pLVar5[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                 *(undefined4 *)((long)local_1e0 + 0x34);
            *(undefined4 *)&pLVar5[3]._vptr_Layer = *(undefined4 *)(local_1e0 + 7);
            *(void **)&pLVar5[3].one_blob_only = local_1e0[8];
          }
          bVar7 = false;
          local_1d0 = ppiVar12;
        }
        local_208 = &local_448;
        local_f8 = local_208;
        if (local_440 != (int *)0x0) {
          local_fc = 0xffffffff;
          LOCK();
          local_100 = *local_440;
          *local_440 = *local_440 + -1;
          UNLOCK();
          if (local_100 == 1) {
            if (local_428 == (Allocator *)0x0) {
              local_60 = local_448;
              if (local_448 != (void *)0x0) {
                free(local_448);
              }
            }
            else {
              (*local_428->_vptr_Allocator[3])(local_428,local_448);
            }
          }
        }
        local_448 = (void *)0x0;
        local_438 = 0;
        local_430 = 0;
        local_420 = 0;
        local_41c = 0;
        local_418 = 0;
        local_414 = 0;
        local_410 = 0;
        local_408 = 0;
        local_440 = (int *)0x0;
        local_1f8 = &local_400;
        local_118 = local_1f8;
        if (local_3f8 != (int *)0x0) {
          local_11c = 0xffffffff;
          LOCK();
          local_120 = *local_3f8;
          *local_3f8 = *local_3f8 + -1;
          UNLOCK();
          if (local_120 == 1) {
            if (local_3e0 == (Allocator *)0x0) {
              local_50 = local_400;
              if (local_400 != (void *)0x0) {
                free(local_400);
              }
            }
            else {
              (*local_3e0->_vptr_Allocator[3])(local_3e0,local_400);
            }
          }
        }
        local_400 = (void *)0x0;
        local_3f0 = 0;
        local_3e8 = 0;
        local_3d8 = 0;
        local_3d4 = 0;
        local_3d0 = 0;
        local_3cc = 0;
        local_3c8 = 0;
        local_3c0 = 0;
        local_3f8 = (int *)0x0;
        if (bVar7) {
          return local_244;
        }
      }
    }
    local_258 = local_258 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_convolution()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "Convolution")
            continue;

        // find convolution layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolution %s\n", convolution->name.c_str());

        {
            const int maxk = convolution->kernel_w * convolution->kernel_h;
            const int num_input = convolution->weight_data_size / convolution->num_output / maxk;

            ncnn::Mat weight_data_r2 = convolution->weight_data.reshape(maxk, num_input, convolution->num_output);

            ncnn::Mat weight_data_int8;

            ncnn::Option opt_q = opt;
            opt_q.blob_allocator = convolution->weight_data.allocator;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            convolution->weight_data = weight_data_int8.reshape(convolution->weight_data_size);
        }

        convolution->int8_scale_term = 2;
        convolution->weight_data_int8_scales = weight_data_int8_scales;
        convolution->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}